

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O1

void output(code_int code,GifCtx *ctx)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = ctx->cur_bits;
  if ((long)iVar1 != -1000) {
    uVar2 = (long)code << ((byte)iVar1 & 0x3f) | ctx->cur_accum & masks[iVar1];
    if (iVar1 < 1) {
      uVar2 = (long)code;
    }
    ctx->cur_accum = uVar2;
    iVar1 = ctx->n_bits + iVar1;
    ctx->cur_bits = iVar1;
    if (7 < iVar1) {
      do {
        iVar1 = ctx->a_count;
        ctx->a_count = iVar1 + 1;
        ctx->accum[iVar1] = (char)ctx->cur_accum;
        if (0xfd < ctx->a_count) {
          flush_char(ctx);
        }
        ctx->cur_accum = ctx->cur_accum >> 8;
        iVar1 = ctx->cur_bits;
        ctx->cur_bits = iVar1 + -8;
      } while (0xf < iVar1);
    }
    if ((ctx->maxcode < ctx->free_ent) || (ctx->clear_flg != 0)) {
      if (ctx->clear_flg == 0) {
        iVar1 = ctx->n_bits + 1;
        ctx->n_bits = iVar1;
        if (iVar1 == 0xc) {
          ctx->maxcode = 0x1000;
        }
        else {
          ctx->maxcode = ~(-1 << ((byte)iVar1 & 0x1f));
        }
      }
      else {
        ctx->n_bits = ctx->g_init_bits;
        ctx->maxcode = ~(-1 << ((byte)ctx->g_init_bits & 0x1f));
        ctx->clear_flg = 0;
      }
    }
    if (ctx->EOFCode == code) {
      if (0 < ctx->cur_bits) {
        do {
          iVar1 = ctx->a_count;
          ctx->a_count = iVar1 + 1;
          ctx->accum[iVar1] = (char)ctx->cur_accum;
          if (0xfd < ctx->a_count) {
            flush_char(ctx);
          }
          ctx->cur_accum = ctx->cur_accum >> 8;
          iVar1 = ctx->cur_bits;
          ctx->cur_bits = iVar1 + -8;
        } while (8 < iVar1);
      }
      ctx->cur_bits = -1000;
      flush_char(ctx);
      return;
    }
  }
  return;
}

Assistant:

static void output(code_int code, GifCtx *ctx)
{
	if (ctx->cur_bits == CUR_BITS_FINISHED)
		return;
	ctx->cur_accum &= masks[ctx->cur_bits];

	if(ctx->cur_bits > 0) {
		ctx->cur_accum |= ((long)code << ctx->cur_bits);
	} else {
		ctx->cur_accum = code;
	}

	ctx->cur_bits += ctx->n_bits;

	while(ctx->cur_bits >= 8) {
		char_out((unsigned int)(ctx->cur_accum & 0xff), ctx);
		ctx->cur_accum >>= 8;
		ctx->cur_bits -= 8;
	}

	/*
	 * If the next entry is going to be too big for the code size,
	 * then increase it, if possible.
	 */
	if(ctx->free_ent > ctx->maxcode || ctx->clear_flg) {
		if(ctx->clear_flg) {
			ctx->maxcode = MAXCODE (ctx->n_bits = ctx->g_init_bits);
			ctx->clear_flg = 0;
		} else {
			++(ctx->n_bits);
			if(ctx->n_bits == maxbits) {
				ctx->maxcode = maxmaxcode;
			} else {
				ctx->maxcode = MAXCODE(ctx->n_bits);
			}
		}
	}

	if(code == ctx->EOFCode) {
		/* At EOF, write the rest of the buffer. */
		while(ctx->cur_bits > 0) {
			char_out((unsigned int)(ctx->cur_accum & 0xff), ctx);
			ctx->cur_accum >>= 8;
			ctx->cur_bits -= 8;
		}
		/* Flag that it's done to prevent re-entry. */
		ctx->cur_bits = CUR_BITS_FINISHED;

		flush_char(ctx);
	}
}